

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bs.cc
# Opt level: O2

base_learner * bs_setup(options_i *options,vw *all)

{
  int iVar1;
  option_group_definition *this;
  ostream *poVar2;
  vector<double,_std::allocator<double>_> *this_00;
  base_learner *l;
  single_learner *base;
  learner<bs,_example> *plVar3;
  size_t sStack_280;
  allocator local_26c;
  allocator local_26b;
  allocator local_26a;
  allocator local_269;
  free_ptr<bs> data;
  string type_string;
  string local_238 [32];
  string local_218;
  string local_1f8 [32];
  string local_1d8;
  string local_1b8;
  undefined1 local_198 [112];
  bool local_128;
  option_group_definition new_options;
  undefined1 local_c0 [112];
  bool local_50;
  
  scoped_calloc_or_throw<bs>();
  std::__cxx11::string::string((string *)&type_string,"mean",(allocator *)local_198);
  std::__cxx11::string::string((string *)&local_1b8,"Bootstrap",(allocator *)local_198);
  VW::config::option_group_definition::option_group_definition(&new_options,&local_1b8);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::string::string((string *)&local_1d8,"bootstrap",&local_269);
  VW::config::typed_option<unsigned_int>::typed_option
            ((typed_option<unsigned_int> *)local_198,&local_1d8,
             &(data._M_t.super___uniq_ptr_impl<bs,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_bs_*,_void_(*)(void_*)>.super__Head_base<0UL,_bs_*,_false>.
              _M_head_impl)->B);
  local_128 = true;
  std::__cxx11::string::string
            (local_1f8,"k-way bootstrap by online importance resampling",&local_26a);
  std::__cxx11::string::_M_assign((string *)(local_198 + 0x30));
  this = VW::config::option_group_definition::add<VW::config::typed_option<unsigned_int>&>
                   (&new_options,(typed_option<unsigned_int> *)local_198);
  std::__cxx11::string::string((string *)&local_218,"bs_type",&local_26b);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_c0,&local_218,&type_string);
  local_50 = true;
  std::__cxx11::string::string(local_238,"prediction type {mean,vote}",&local_26c);
  std::__cxx11::string::_M_assign((string *)(local_c0 + 0x30));
  VW::config::option_group_definition::add<VW::config::typed_option<std::__cxx11::string>&>
            (this,(typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_c0);
  std::__cxx11::string::~string(local_238);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_c0);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string(local_1f8);
  VW::config::typed_option<unsigned_int>::~typed_option((typed_option<unsigned_int> *)local_198);
  std::__cxx11::string::~string((string *)&local_1d8);
  (**options->_vptr_options_i)(options,&new_options);
  std::__cxx11::string::string((string *)local_198,"bootstrap",(allocator *)local_c0);
  iVar1 = (*options->_vptr_options_i[1])(options,local_198);
  std::__cxx11::string::~string((string *)local_198);
  if ((char)iVar1 == '\0') {
    plVar3 = (learner<bs,_example> *)0x0;
    goto LAB_001a7785;
  }
  (data._M_t.super___uniq_ptr_impl<bs,_void_(*)(void_*)>._M_t.
   super__Tuple_impl<0UL,_bs_*,_void_(*)(void_*)>.super__Head_base<0UL,_bs_*,_false>._M_head_impl)->
  lb = -3.4028235e+38;
  (data._M_t.super___uniq_ptr_impl<bs,_void_(*)(void_*)>._M_t.
   super__Tuple_impl<0UL,_bs_*,_void_(*)(void_*)>.super__Head_base<0UL,_bs_*,_false>._M_head_impl)->
  ub = 3.4028235e+38;
  std::__cxx11::string::string((string *)local_198,"bs_type",(allocator *)local_c0);
  iVar1 = (*options->_vptr_options_i[1])(options,local_198);
  std::__cxx11::string::~string((string *)local_198);
  if ((char)iVar1 == '\0') {
LAB_001a76dc:
    sStack_280 = 0;
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)&type_string);
    if (iVar1 == 0) goto LAB_001a76dc;
    iVar1 = std::__cxx11::string::compare((char *)&type_string);
    if (iVar1 != 0) {
      poVar2 = std::operator<<((ostream *)&std::cerr,
                               "warning: bs_type must be in {\'mean\',\'vote\'}; resetting to mean."
                              );
      std::endl<char,std::char_traits<char>>(poVar2);
      goto LAB_001a76dc;
    }
    sStack_280 = 1;
  }
  (data._M_t.super___uniq_ptr_impl<bs,_void_(*)(void_*)>._M_t.
   super__Tuple_impl<0UL,_bs_*,_void_(*)(void_*)>.super__Head_base<0UL,_bs_*,_false>._M_head_impl)->
  bs_type = sStack_280;
  this_00 = (vector<double,_std::allocator<double>_> *)operator_new(0x18);
  (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (data._M_t.super___uniq_ptr_impl<bs,_void_(*)(void_*)>._M_t.
   super__Tuple_impl<0UL,_bs_*,_void_(*)(void_*)>.super__Head_base<0UL,_bs_*,_false>._M_head_impl)->
  pred_vec = this_00;
  std::vector<double,_std::allocator<double>_>::reserve
            (this_00,(ulong)(data._M_t.super___uniq_ptr_impl<bs,_void_(*)(void_*)>._M_t.
                             super__Tuple_impl<0UL,_bs_*,_void_(*)(void_*)>.
                             super__Head_base<0UL,_bs_*,_false>._M_head_impl)->B);
  (data._M_t.super___uniq_ptr_impl<bs,_void_(*)(void_*)>._M_t.
   super__Tuple_impl<0UL,_bs_*,_void_(*)(void_*)>.super__Head_base<0UL,_bs_*,_false>._M_head_impl)->
  all = all;
  l = setup_base(options,all);
  base = LEARNER::as_singleline<char,char>(l);
  plVar3 = LEARNER::init_learner<bs,example,LEARNER::learner<char,example>>
                     (&data,base,predict_or_learn<true>,predict_or_learn<false>,
                      (ulong)(data._M_t.super___uniq_ptr_impl<bs,_void_(*)(void_*)>._M_t.
                              super__Tuple_impl<0UL,_bs_*,_void_(*)(void_*)>.
                              super__Head_base<0UL,_bs_*,_false>._M_head_impl)->B);
  *(undefined8 *)(plVar3 + 0x58) = *(undefined8 *)(plVar3 + 0x18);
  *(code **)(plVar3 + 0x68) = finish_example;
  *(undefined8 *)(plVar3 + 0xb8) = *(undefined8 *)(plVar3 + 0x18);
  *(undefined8 *)(plVar3 + 0xc0) = *(undefined8 *)(plVar3 + 0x20);
  *(code **)(plVar3 + 200) = finish;
LAB_001a7785:
  VW::config::option_group_definition::~option_group_definition(&new_options);
  std::__cxx11::string::~string((string *)&type_string);
  std::unique_ptr<bs,_void_(*)(void_*)>::~unique_ptr(&data);
  return (base_learner *)plVar3;
}

Assistant:

base_learner* bs_setup(options_i& options, vw& all)
{
  auto data = scoped_calloc_or_throw<bs>();
  std::string type_string("mean");
  option_group_definition new_options("Bootstrap");
  new_options.add(make_option("bootstrap", data->B).keep().help("k-way bootstrap by online importance resampling"))
      .add(make_option("bs_type", type_string).keep().help("prediction type {mean,vote}"));
  options.add_and_parse(new_options);

  if (!options.was_supplied("bootstrap"))
    return nullptr;

  data->ub = FLT_MAX;
  data->lb = -FLT_MAX;

  if (options.was_supplied("bs_type"))
  {
    if (type_string.compare("mean") == 0)
      data->bs_type = BS_TYPE_MEAN;
    else if (type_string.compare("vote") == 0)
      data->bs_type = BS_TYPE_VOTE;
    else
    {
      std::cerr << "warning: bs_type must be in {'mean','vote'}; resetting to mean." << std::endl;
      data->bs_type = BS_TYPE_MEAN;
    }
  }
  else  // by default use mean
    data->bs_type = BS_TYPE_MEAN;

  data->pred_vec = new vector<double>();
  data->pred_vec->reserve(data->B);
  data->all = &all;

  learner<bs, example>& l = init_learner(
      data, as_singleline(setup_base(options, all)), predict_or_learn<true>, predict_or_learn<false>, data->B);
  l.set_finish_example(finish_example);
  l.set_finish(finish);

  return make_base(l);
}